

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

long __thiscall
mkvparser::Track::GetNext(Track *this,BlockEntry *pCurrEntry,BlockEntry **pNextEntry)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  longlong lVar3;
  undefined4 extraout_var_00;
  BlockEntry *pBVar4;
  long lVar5;
  Block *pNextBlock;
  int i;
  long status;
  Cluster *pCluster;
  Block *pCurrBlock;
  BlockEntry **pNextEntry_local;
  BlockEntry *pCurrEntry_local;
  Track *this_local;
  Block *this_00;
  
  if (pCurrEntry == (BlockEntry *)0x0) {
    __assert_fail("pCurrEntry",
                  "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x127d,
                  "long mkvparser::Track::GetNext(const BlockEntry *, const BlockEntry *&) const");
  }
  bVar1 = BlockEntry::EOS(pCurrEntry);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!pCurrEntry->EOS()",
                  "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x127e,
                  "long mkvparser::Track::GetNext(const BlockEntry *, const BlockEntry *&) const");
  }
  iVar2 = (*pCurrEntry->_vptr_BlockEntry[2])();
  this_00 = (Block *)CONCAT44(extraout_var,iVar2);
  bVar1 = false;
  if (this_00 != (Block *)0x0) {
    lVar3 = Block::GetTrackNumber(this_00);
    bVar1 = lVar3 == (this->m_info).number;
  }
  if (!bVar1) {
    __assert_fail("pCurrBlock && pCurrBlock->GetTrackNumber() == m_info.number",
                  "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x1281,
                  "long mkvparser::Track::GetNext(const BlockEntry *, const BlockEntry *&) const");
  }
  if ((this_00 == (Block *)0x0) ||
     (lVar3 = Block::GetTrackNumber(this_00), lVar3 != (this->m_info).number)) {
    this_local = (Track *)0xffffffffffffffff;
  }
  else {
    status = (long)BlockEntry::GetCluster(pCurrEntry);
    if ((Cluster *)status == (Cluster *)0x0) {
      __assert_fail("pCluster",
                    "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                    ,0x1286,
                    "long mkvparser::Track::GetNext(const BlockEntry *, const BlockEntry *&) const")
      ;
    }
    bVar1 = Cluster::EOS((Cluster *)status);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      __assert_fail("!pCluster->EOS()",
                    "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                    ,0x1287,
                    "long mkvparser::Track::GetNext(const BlockEntry *, const BlockEntry *&) const")
      ;
    }
    this_local = (Track *)Cluster::GetNext((Cluster *)status,pCurrEntry,pNextEntry);
    if (-1 < (long)this_local) {
      pNextBlock._4_4_ = 0;
      do {
        while (*pNextEntry == (BlockEntry *)0x0) {
          status = (long)Segment::GetNext(this->m_pSegment,(Cluster *)status);
          if ((Cluster *)status == (Cluster *)0x0) {
            pBVar4 = GetEOS(this);
            *pNextEntry = pBVar4;
            return 1;
          }
          bVar1 = Cluster::EOS((Cluster *)status);
          if (bVar1) {
            bVar1 = Segment::DoneParsing(this->m_pSegment);
            if (!bVar1) {
              *pNextEntry = (BlockEntry *)0x0;
              return -3;
            }
            pBVar4 = GetEOS(this);
            *pNextEntry = pBVar4;
            return 1;
          }
          lVar5 = Cluster::GetFirst((Cluster *)status,pNextEntry);
          if (lVar5 < 0) {
            return lVar5;
          }
          if ((*pNextEntry != (BlockEntry *)0x0) &&
             (pNextBlock._4_4_ = pNextBlock._4_4_ + 1, 99 < pNextBlock._4_4_)) {
            pBVar4 = GetEOS(this);
            *pNextEntry = pBVar4;
            return 1;
          }
        }
        iVar2 = (*(*pNextEntry)->_vptr_BlockEntry[2])();
        if ((Block *)CONCAT44(extraout_var_00,iVar2) == (Block *)0x0) {
          __assert_fail("pNextBlock",
                        "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                        ,0x1291,
                        "long mkvparser::Track::GetNext(const BlockEntry *, const BlockEntry *&) const"
                       );
        }
        lVar3 = Block::GetTrackNumber((Block *)CONCAT44(extraout_var_00,iVar2));
        if (lVar3 == (this->m_info).number) {
          return 0;
        }
        this_local = (Track *)Cluster::GetNext((Cluster *)status,*pNextEntry,pNextEntry);
      } while (-1 < (long)this_local);
    }
  }
  return (long)this_local;
}

Assistant:

long Track::GetNext(const BlockEntry* pCurrEntry,
                    const BlockEntry*& pNextEntry) const {
  assert(pCurrEntry);
  assert(!pCurrEntry->EOS());  //?

  const Block* const pCurrBlock = pCurrEntry->GetBlock();
  assert(pCurrBlock && pCurrBlock->GetTrackNumber() == m_info.number);
  if (!pCurrBlock || pCurrBlock->GetTrackNumber() != m_info.number)
    return -1;

  const Cluster* pCluster = pCurrEntry->GetCluster();
  assert(pCluster);
  assert(!pCluster->EOS());

  long status = pCluster->GetNext(pCurrEntry, pNextEntry);

  if (status < 0)  // error
    return status;

  for (int i = 0;;) {
    while (pNextEntry) {
      const Block* const pNextBlock = pNextEntry->GetBlock();
      assert(pNextBlock);

      if (pNextBlock->GetTrackNumber() == m_info.number)
        return 0;

      pCurrEntry = pNextEntry;

      status = pCluster->GetNext(pCurrEntry, pNextEntry);

      if (status < 0)  // error
        return status;
    }

    pCluster = m_pSegment->GetNext(pCluster);

    if (pCluster == NULL) {
      pNextEntry = GetEOS();
      return 1;
    }

    if (pCluster->EOS()) {
      if (m_pSegment->DoneParsing()) {
        pNextEntry = GetEOS();
        return 1;
      }

      // TODO: there is a potential O(n^2) problem here: we tell the
      // caller to (pre)load another cluster, which he does, but then he
      // calls GetNext again, which repeats the same search.  This is
      // a pathological case, since the only way it can happen is if
      // there exists a long sequence of clusters none of which contain a
      // block from this track.  One way around this problem is for the
      // caller to be smarter when he loads another cluster: don't call
      // us back until you have a cluster that contains a block from this
      // track. (Of course, that's not cheap either, since our caller
      // would have to scan the each cluster as it's loaded, so that
      // would just push back the problem.)

      pNextEntry = NULL;
      return E_BUFFER_NOT_FULL;
    }

    status = pCluster->GetFirst(pNextEntry);

    if (status < 0)  // error
      return status;

    if (pNextEntry == NULL)  // empty cluster
      continue;

    ++i;

    if (i >= 100)
      break;
  }

  // NOTE: if we get here, it means that we didn't find a block with
  // a matching track number after lots of searching, so we give
  // up trying.

  pNextEntry = GetEOS();  // so we can return a non-NULL value
  return 1;
}